

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlStringGetNodeList(xmlDoc *doc,xmlChar *value)

{
  byte bVar1;
  int iVar2;
  xmlBufPtr buf;
  xmlEntityPtr pxVar3;
  xmlNodePtr pxVar4;
  xmlNodePtr pxVar5;
  _xmlNode *p_Var6;
  xmlNodePtr pxVar7;
  xmlChar *pxVar8;
  byte *pbVar9;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  bool bVar13;
  xmlChar buffer [10];
  xmlChar *local_58;
  xmlNodePtr local_50;
  xmlChar local_3a [10];
  
  if (value == (xmlChar *)0x0) {
    pxVar4 = (xmlNodePtr)0x0;
  }
  else {
    pxVar4 = (xmlNodePtr)0x0;
    buf = xmlBufCreateSize(0);
    if (buf != (xmlBufPtr)0x0) {
      xmlBufSetAllocationScheme(buf,XML_BUFFER_ALLOC_DOUBLEIT);
      local_50 = (xmlNodePtr)0x0;
      local_58 = (xmlChar *)0x0;
      pxVar5 = (xmlNodePtr)0x0;
      pbVar11 = value;
      do {
        pbVar9 = pbVar11 + 3;
        pbVar12 = pbVar11;
        while( true ) {
          pbVar12 = pbVar12 + 1;
          if (*pbVar11 == 0) {
            if ((pbVar11 != value) || (pxVar5 == (xmlNodePtr)0x0)) {
              xmlBufAdd(buf,value,(int)pbVar11 - (int)value);
            }
            iVar2 = xmlBufIsEmpty(buf);
            if (iVar2 == 0) {
              pxVar4 = xmlNewText((xmlChar *)0x0);
              if (pxVar4 == (xmlNodePtr)0x0) {
                pxVar4 = (xmlNodePtr)0x0;
                pxVar7 = pxVar5;
              }
              else {
                pxVar4->doc = doc;
                pxVar8 = xmlBufDetach(buf);
                pxVar4->content = pxVar8;
                if (local_50 == (xmlNodePtr)0x0) {
                  pxVar7 = (xmlNodePtr)0x0;
                }
                else {
                  xmlAddNextSibling(local_50,pxVar4);
                  pxVar4 = pxVar5;
                  pxVar7 = (xmlNodePtr)0x0;
                }
              }
            }
            else {
              pxVar7 = (xmlNodePtr)0x0;
              pxVar4 = pxVar5;
            }
            goto LAB_0018363c;
          }
          if (*pbVar11 == 0x26) break;
          pbVar11 = pbVar11 + 1;
          pbVar9 = pbVar9 + 1;
        }
        if ((pbVar11 == value) ||
           (iVar2 = xmlBufAdd(buf,value,(int)pbVar11 - (int)value), iVar2 == 0)) {
          if (pbVar11[1] == 0x23) {
            if (pbVar11[2] == 0x78) {
              bVar1 = pbVar11[3];
              pbVar11 = pbVar11 + 3;
              iVar2 = 0;
              bVar13 = bVar1 == 0x3b;
              if (!bVar13) {
                iVar2 = 0;
                do {
                  if ((byte)(bVar1 - 0x30) < 10) {
                    iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x30;
                  }
                  else if ((byte)(bVar1 + 0x9f) < 6) {
                    iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x57;
                  }
                  else {
                    if (5 < (byte)(bVar1 + 0xbf)) {
                      iVar2 = 0;
                      __xmlSimpleError(2,0x514,(xmlNodePtr)doc,
                                       "invalid hexadecimal character value\n",(char *)0x0);
                      break;
                    }
                    iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x37;
                  }
                  bVar1 = pbVar11[1];
                  pbVar11 = pbVar11 + 1;
                  bVar13 = bVar1 == 0x3b;
                } while (!bVar13);
              }
            }
            else {
              bVar1 = pbVar11[2];
              pbVar11 = pbVar11 + 2;
              iVar2 = 0;
              bVar13 = bVar1 == 0x3b;
              if (!bVar13) {
                if ((byte)(bVar1 - 0x30) < 10) {
                  iVar2 = 0;
                  do {
                    pbVar11 = pbVar9;
                    iVar2 = (uint)bVar1 + iVar2 * 10 + -0x30;
                    bVar1 = *pbVar11;
                    bVar13 = bVar1 == 0x3b;
                    if (bVar13) goto LAB_001835bb;
                    pbVar9 = pbVar11 + 1;
                  } while ((byte)(bVar1 - 0x30) < 10);
                }
                iVar2 = 0;
                __xmlSimpleError(2,0x515,(xmlNodePtr)doc,"invalid decimal character value\n",
                                 (char *)0x0);
              }
            }
LAB_001835bb:
            value = pbVar11 + bVar13;
LAB_001835be:
            pbVar11 = value;
            if (iVar2 != 0) {
              iVar2 = xmlCopyCharMultiByte(local_3a,iVar2);
              local_3a[iVar2] = '\0';
              iVar2 = xmlBufCat(buf,local_3a);
              bVar13 = iVar2 == 0;
              if (!bVar13) goto LAB_001835f3;
            }
            bVar13 = true;
          }
          else {
            value = pbVar11 + 1;
            lVar10 = 0;
LAB_00183403:
            if (*pbVar12 == 0) {
              __xmlSimpleError(2,0x516,(xmlNodePtr)doc,"unterminated entity reference %15s\n",
                               (char *)value);
            }
            else {
              if (*pbVar12 != 0x3b) goto code_r0x00183410;
              if (lVar10 == 0) goto LAB_00183581;
              local_58 = xmlStrndup(value,-(int)lVar10);
              pxVar3 = xmlGetDocEntity(doc,local_58);
              if ((pxVar3 != (xmlEntityPtr)0x0) && (pxVar3->etype == XML_INTERNAL_PREDEFINED_ENTITY)
                 ) {
                iVar2 = xmlBufCat(buf,pxVar3->content);
                pxVar4 = local_50;
                if (iVar2 == 0) goto LAB_0018356b;
                goto LAB_00183487;
              }
              iVar2 = xmlBufIsEmpty(buf);
              pxVar7 = pxVar5;
              pxVar4 = local_50;
              if (iVar2 == 0) {
                pxVar7 = xmlNewText((xmlChar *)0x0);
                if (pxVar7 == (xmlNodePtr)0x0) goto LAB_00183487;
                pxVar7->doc = doc;
                pxVar8 = xmlBufDetach(buf);
                pxVar7->content = pxVar8;
                pxVar4 = pxVar7;
                if (local_50 != (xmlNodePtr)0x0) {
                  pxVar4 = xmlAddNextSibling(local_50,pxVar7);
                  pxVar7 = pxVar5;
                }
              }
              local_50 = pxVar4;
              pxVar4 = xmlNewReference(doc,local_58);
              pxVar5 = pxVar7;
              if (pxVar4 != (xmlNodePtr)0x0) {
                if ((pxVar3 != (xmlEntityPtr)0x0) && (pxVar3->children == (_xmlNode *)0x0)) {
                  pxVar3->children = (_xmlNode *)0xffffffffffffffff;
                  pxVar5 = xmlStringGetNodeList(doc,pxVar4->content);
                  pxVar3->children = pxVar5;
                  pxVar3->owner = 1;
                  if (pxVar5 != (xmlNodePtr)0x0) {
                    do {
                      p_Var6 = pxVar5;
                      p_Var6->parent = (_xmlNode *)pxVar3;
                      pxVar5 = p_Var6->next;
                    } while (p_Var6->next != (_xmlNode *)0x0);
                    pxVar3->last = p_Var6;
                  }
                }
                pxVar5 = pxVar4;
                if (local_50 != (xmlNodePtr)0x0) {
                  pxVar4 = xmlAddNextSibling(local_50,pxVar4);
                  pxVar5 = pxVar7;
                }
LAB_0018356b:
                (*xmlFree)(local_58);
                local_58 = (xmlChar *)0x0;
                local_50 = pxVar4;
LAB_00183581:
                value = pbVar12 + 1;
                iVar2 = 0;
                goto LAB_001835be;
              }
            }
LAB_00183487:
            bVar13 = false;
            pbVar11 = pbVar12;
          }
        }
        else {
          bVar13 = false;
        }
LAB_001835f3:
      } while (bVar13);
      pxVar4 = (xmlNodePtr)0x0;
      pxVar7 = pxVar5;
LAB_0018363c:
      xmlBufFree(buf);
      if (local_58 != (xmlChar *)0x0) {
        (*xmlFree)(local_58);
      }
      if (pxVar7 != (xmlNodePtr)0x0) {
        xmlFreeNodeList(pxVar7);
      }
    }
  }
  return pxVar4;
code_r0x00183410:
  pbVar12 = pbVar12 + 1;
  lVar10 = lVar10 + -1;
  goto LAB_00183403;
}

Assistant:

xmlNodePtr
xmlStringGetNodeList(const xmlDoc *doc, const xmlChar *value) {
    xmlNodePtr ret = NULL, head = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val = NULL;
    const xmlChar *cur = value;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;

    if (value == NULL) return(NULL);

    buf = xmlBufCreateSize(0);
    if (buf == NULL) return(NULL);
    xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);

    q = cur;
    while (*cur != 0) {
	if (cur[0] == '&') {
	    int charval = 0;
	    xmlChar tmp;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	    }
	    q = cur;
	    if ((cur[1] == '#') && (cur[2] == 'x')) {
		cur += 3;
		tmp = *cur;
		while (tmp != ';') { /* Non input consuming loop */
                    /* Don't check for integer overflow, see above. */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			xmlTreeErr(XML_TREE_INVALID_HEX, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    tmp = *cur;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else if  (cur[1] == '#') {
		cur += 2;
		tmp = *cur;
		while (tmp != ';') { /* Non input consuming loops */
                    /* Don't check for integer overflow, see above. */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			xmlTreeErr(XML_TREE_INVALID_DEC, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    tmp = *cur;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
		q = cur;
		while ((*cur != 0) && (*cur != ';')) cur++;
		if (*cur == 0) {
		    xmlTreeErr(XML_TREE_UNTERMINATED_ENTITY,
		               (xmlNodePtr) doc, (const char *) q);
		    goto out;
		}
		if (cur != q) {
		    /*
		     * Predefined entities don't generate nodes
		     */
		    val = xmlStrndup(q, cur - q);
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {

			if (xmlBufCat(buf, ent->content))
			    goto out;

		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
                            if (node == NULL)
                                goto out;
			    node->content = xmlBufDetach(buf);

			    if (last == NULL) {
				last = head = node;
			    } else {
				last = xmlAddNextSibling(last, node);
			    }
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewReference(doc, val);
			if (node == NULL)
			    goto out;
			if ((ent != NULL) && (ent->children == NULL)) {
			    xmlNodePtr temp;

                            /* Set to non-NULL value to avoid recursion. */
			    ent->children = (xmlNodePtr) -1;
			    ent->children = xmlStringGetNodeList(doc,
				    (const xmlChar*)node->content);
			    ent->owner = 1;
			    temp = ent->children;
			    while (temp) {
				temp->parent = (xmlNodePtr)ent;
				ent->last = temp;
				temp = temp->next;
			    }
			}
			if (last == NULL) {
			    last = head = node;
			} else {
			    last = xmlAddNextSibling(last, node);
			}
		    }
		    xmlFree(val);
                    val = NULL;
		}
		cur++;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int len;

		len = xmlCopyCharMultiByte(buffer, charval);
		buffer[len] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
		charval = 0;
	    }
	} else
	    cur++;
    }
    if ((cur != q) || (head == NULL)) {
        /*
	 * Handle the last piece of text.
	 */
	xmlBufAdd(buf, q, cur - q);
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
        if (node == NULL)
            goto out;
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    head = node;
	} else {
	    xmlAddNextSibling(last, node);
	}
    }

    ret = head;
    head = NULL;

out:
    xmlBufFree(buf);
    if (val != NULL) xmlFree(val);
    if (head != NULL) xmlFreeNodeList(head);
    return(ret);
}